

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O1

tuple<double_&,_double_&>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<std::_Fwd_list_iterator<double>>const&,boost::iterator_range<std::_Fwd_list_iterator<double>>&>>
          (_Tuple_impl<1UL,_double_&> param_1,undefined8 param_2,long *param_3)

{
  long lVar1;
  _Head_base<0UL,_double_&,_false> _Var2;
  tuple<double_&,_double_&> tVar3;
  
  lVar1 = *(long *)param_3[1];
  if (lVar1 != ((long *)param_3[1])[1]) {
    _Var2._M_head_impl = (double *)*param_3;
    if (*_Var2._M_head_impl != _Var2._M_head_impl[1]) {
      *(long *)param_1.super__Head_base<1UL,_double_&,_false>._M_head_impl =
           (long)*_Var2._M_head_impl + 8;
      *(long *)((long)param_1.super__Head_base<1UL,_double_&,_false>._M_head_impl + 8) = lVar1 + 8;
      tVar3.super__Tuple_impl<0UL,_double_&,_double_&>.super__Head_base<0UL,_double_&,_false>.
      _M_head_impl = _Var2._M_head_impl;
      tVar3.super__Tuple_impl<0UL,_double_&,_double_&>.super__Tuple_impl<1UL,_double_&>.
      super__Head_base<1UL,_double_&,_false>._M_head_impl =
           param_1.super__Head_base<1UL,_double_&,_false>._M_head_impl;
      return (tuple<double_&,_double_&>)tVar3.super__Tuple_impl<0UL,_double_&,_double_&>;
    }
  }
  __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                "reference boost::iterator_range_detail::iterator_range_base<std::_Fwd_list_iterator<double>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = std::_Fwd_list_iterator<double>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
               );
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }